

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError PaUtil_GetHostApiRepresentation(PaUtilHostApiRepresentation **hostApi,PaHostApiTypeId type)

{
  long lVar1;
  
  if (initializationCount_ == 0) {
    return -10000;
  }
  if (0 < (long)hostApisCount_) {
    lVar1 = 0;
    do {
      if ((hostApis_[lVar1]->info).type == type) {
        *hostApi = hostApis_[lVar1];
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (hostApisCount_ != lVar1);
  }
  return -0x26fb;
}

Assistant:

PaError PaUtil_GetHostApiRepresentation( struct PaUtilHostApiRepresentation **hostApi,
        PaHostApiTypeId type )
{
    PaError result;
    int i;

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;

        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                *hostApi = hostApis_[i];
                result = paNoError;
                break;
            }
        }
    }

    return result;
}